

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv4-packet.cc
# Opt level: O2

void __thiscall Ipv4Packet::Print(Ipv4Packet *this,ostream *os)

{
  ostream *poVar1;
  string sStack_48;
  
  poVar1 = std::operator<<(os,"Ipv4 Packet:");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,'\t');
  poVar1 = std::operator<<(poVar1,"source ip: ");
  num2ip_abi_cxx11_(&sStack_48,this->sip);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&sStack_48);
  poVar1 = std::operator<<(os,'\t');
  poVar1 = std::operator<<(poVar1,"destination ip: ");
  num2ip_abi_cxx11_(&sStack_48,this->dip);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&sStack_48);
  poVar1 = std::operator<<(os,'\t');
  poVar1 = std::operator<<(poVar1,"total length: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->tlen);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,'\t');
  poVar1 = std::operator<<(poVar1,"identification: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->id);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,'\t');
  poVar1 = std::operator<<(poVar1,"flags: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->flags);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,'\t');
  poVar1 = std::operator<<(poVar1,"fragment offset: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->offset);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<(os,'\t');
  poVar1 = std::operator<<(poVar1,"protocol: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void Ipv4Packet::Print(std::ostream& os)
{
    os << "Ipv4 Packet:" << '\n';
    os << '\t' << "source ip: " << num2ip(sip) << '\n';
    os << '\t' << "destination ip: " << num2ip(dip) << '\n';
    os << '\t' << "total length: " << tlen << '\n';
    os << '\t' << "identification: " << id << '\n';
    os << '\t' << "flags: " << flags << '\n';
    os << '\t' << "fragment offset: " << offset << '\n';
    os << '\t' << "protocol: " << (uint32_t)protocol << '\n';
    os << std::endl;
}